

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2i.c
# Opt level: O3

Gia_Man_t * Gia_ManInterTest(Gia_Man_t *p)

{
  uint *puVar1;
  lit *end;
  void *pvVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  uint uVar5;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p_00;
  sat_solver2 *psVar6;
  int *piVar7;
  Vec_Ptr_t *pVVar8;
  Int2_Man_t *pIVar9;
  Gia_Man_t *p_01;
  uint uVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  timespec ts;
  int Lit;
  timespec local_80;
  Aig_Man_t *local_70;
  Vec_Int_t *local_68;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  sat_solver2 *local_50;
  ulong local_48;
  long local_40;
  Cnf_Dat_t *local_38;
  
  iVar4 = clock_gettime(3,&local_80);
  if (iVar4 < 0) {
    lVar11 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                    SEXT816(CONCAT44(local_80.tv_nsec._4_4_,(int)local_80.tv_nsec)),8);
    lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) +
             CONCAT44(local_80.tv_sec._4_4_,(int)local_80.tv_sec) * -1000000;
  }
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2i.c"
                  ,0xa8,"Gia_Man_t *Gia_ManInterTest(Gia_Man_t *)");
  }
  if (p->vCos->nSize != 1) {
    __assert_fail("Gia_ManCoNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2i.c"
                  ,0xa9,"Gia_Man_t *Gia_ManInterTest(Gia_Man_t *)");
  }
  pAig = Gia_ManToAigSimple(p);
  p_00 = Cnf_Derive(pAig,1);
  psVar6 = sat_solver2_new();
  psVar6->fVerbose = 1;
  sat_solver2_setnvars(psVar6,p_00->nVars * 2 + 1);
  pVVar8 = pAig->vObjs;
  local_70 = pAig;
  if (0 < pVVar8->nSize) {
    lVar12 = 0;
    do {
      pvVar2 = pVVar8->pArray[lVar12];
      if (((pvVar2 != (void *)0x0) && (-1 < p_00->pVarNums[*(int *)((long)pvVar2 + 0x24)])) &&
         ((*(uint *)((long)pvVar2 + 0x18) & 6) != 2)) {
        var_set_partA(psVar6,p_00->pVarNums[*(int *)((long)pvVar2 + 0x24)],1);
        pVVar8 = local_70->vObjs;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar8->nSize);
  }
  if (0 < p_00->nClauses) {
    lVar12 = 0;
    do {
      uVar5 = sat_solver2_addclause(psVar6,p_00->pClauses[lVar12],p_00->pClauses[lVar12 + 1],-1);
      uVar10 = (psVar6->Mem).uPageMask & uVar5;
      if (uVar10 == 0) {
        __assert_fail("k",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satClause.h"
                      ,0x60,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
      }
      puVar1 = (uint *)((psVar6->Mem).pPages[(int)uVar5 >> ((byte)(psVar6->Mem).nPageSize & 0x1f)] +
                       (int)uVar10);
      *puVar1 = *puVar1 | 4;
      lVar12 = lVar12 + 1;
    } while (lVar12 < p_00->nClauses);
  }
  local_40 = lVar11;
  Cnf_DataLift(p_00,p_00->nVars);
  if (0 < p_00->nClauses) {
    lVar11 = 0;
    do {
      lVar12 = lVar11 + 1;
      sat_solver2_addclause(psVar6,p_00->pClauses[lVar11],p_00->pClauses[lVar11 + 1],-1);
      lVar11 = lVar12;
    } while (lVar12 < p_00->nClauses);
  }
  piVar7 = (int *)0x0;
  Cnf_DataLift(p_00,-p_00->nVars);
  uVar5 = local_70->nObjs[3];
  local_68 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < uVar5) {
    iVar4 = uVar5 + 1;
  }
  local_68->nSize = 0;
  local_68->nCap = iVar4;
  local_50 = psVar6;
  if (iVar4 != 0) {
    piVar7 = (int *)malloc((long)iVar4 << 2);
  }
  psVar6 = local_50;
  local_68->pArray = piVar7;
  pVVar8 = local_70->vCis;
  if (0 < pVVar8->nSize) {
    lVar11 = 0;
    local_38 = p_00;
    do {
      uVar5 = local_38->pVarNums[*(int *)((long)pVVar8->pArray[lVar11] + 0x24)];
      uVar10 = local_38->nVars + uVar5;
      if ((int)(uVar10 | uVar5) < 0) {
        __assert_fail("iVarA >= 0 && iVarB >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.h"
                      ,0x117,"int sat_solver2_add_buffer(sat_solver2 *, int, int, int, int, int)");
      }
      local_80.tv_sec._0_4_ = uVar5 * 2;
      local_80.tv_sec._4_4_ = uVar10 * 2 + 1;
      sat_solver2_addclause(psVar6,(lit *)&local_80,(lit *)&local_80.tv_nsec,-1);
      local_80.tv_sec._0_4_ = uVar5 * 2 + 1;
      local_80.tv_sec._4_4_ = uVar10 * 2;
      sat_solver2_addclause(psVar6,(lit *)&local_80,(lit *)&local_80.tv_nsec,-1);
      Vec_IntPush(local_68,uVar5);
      lVar11 = lVar11 + 1;
      pVVar8 = local_70->vCis;
      p_00 = local_38;
    } while (lVar11 < pVVar8->nSize);
  }
  psVar6 = local_50;
  if (0 < local_70->vCos->nSize) {
    uVar5 = p_00->pVarNums[*(int *)((long)*local_70->vCos->pArray + 0x24)];
    local_48 = (ulong)uVar5;
    iVar4 = p_00->nVars;
    uVar10 = iVar4 + uVar5;
    if ((int)(iVar4 * 2 | uVar5 | uVar10) < 0) {
      __assert_fail("iVarA >= 0 && iVarB >= 0 && iVarC >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.h"
                    ,0x143,"int sat_solver2_add_xor(sat_solver2 *, int, int, int, int, int, int)");
    }
    local_58 = uVar5 * 2;
    iVar13 = uVar5 * 2 + 1;
    local_80.tv_sec._4_4_ = uVar10 * 2 + 1;
    local_80.tv_nsec._0_4_ = iVar4 * 4 + 1;
    local_80.tv_sec._0_4_ = iVar13;
    local_60 = local_80.tv_sec._4_4_;
    local_5c = (int)local_80.tv_nsec;
    sat_solver2_addclause(local_50,(lit *)&local_80,(lit *)((long)&local_80.tv_nsec + 4),-1);
    local_80.tv_sec._0_4_ = iVar13;
    local_80.tv_sec._4_4_ = uVar10 * 2;
    local_80.tv_nsec._0_4_ = iVar4 << 2;
    sat_solver2_addclause(psVar6,(lit *)&local_80,(lit *)((long)&local_80.tv_nsec + 4),-1);
    iVar13 = local_58;
    local_80.tv_sec._0_4_ = local_58;
    local_80.tv_sec._4_4_ = local_60;
    end = (lit *)((long)&local_80.tv_nsec + 4);
    local_80.tv_nsec._0_4_ = iVar4 << 2;
    sat_solver2_addclause(psVar6,(lit *)&local_80,end,-1);
    local_80.tv_sec._0_4_ = iVar13;
    local_80.tv_nsec._0_4_ = local_5c;
    local_80.tv_sec._4_4_ = uVar10 * 2;
    sat_solver2_addclause(psVar6,(lit *)&local_80,end,-1);
    pVVar3 = local_68;
    Vec_IntPush(local_68,(int)local_48);
    piVar7 = pVVar3->pArray;
    pIVar9 = Int2_ManStart(psVar6,piVar7,pVVar3->nSize);
    psVar6->pInt2 = pIVar9;
    local_54 = p_00->nVars << 2;
    iVar4 = sat_solver2_solve(psVar6,&local_54,(lit *)&local_50,0,0,0,0);
    if (iVar4 == -1) {
      Sat_Solver2PrintStats(_stdout,psVar6);
      p_01 = (Gia_Man_t *)Int2_ManReadInterpolant(psVar6);
      Gia_ManPrintStats(p_01,(Gps_Par_t *)0x0);
      iVar13 = 3;
      iVar4 = clock_gettime(3,&local_80);
      if (iVar4 < 0) {
        lVar11 = -1;
      }
      else {
        lVar11 = CONCAT44(local_80.tv_nsec._4_4_,(int)local_80.tv_nsec) / 1000 +
                 CONCAT44(local_80.tv_sec._4_4_,(int)local_80.tv_sec) * 1000000;
      }
      lVar11 = lVar11 + local_40;
      Abc_Print(iVar13,"%s =","Total interpolation time");
      Abc_Print(iVar13,"%9.2f sec\n",(double)lVar11 / 1000000.0);
      if (piVar7 != (int *)0x0) {
        free(piVar7);
      }
      free(local_68);
      Cnf_DataFree(p_00);
      Aig_ManStop(local_70);
      sat_solver2_delete(psVar6);
      return p_01;
    }
    __assert_fail("status == l_False",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2i.c"
                  ,0xda,"Gia_Man_t *Gia_ManInterTest(Gia_Man_t *)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Gia_Man_t * Gia_ManInterTest( Gia_Man_t * p )
{
    sat_solver2 * pSat;
    Gia_Man_t * pInter;
    Aig_Man_t * pMan;
    Vec_Int_t * vGVars;
    Cnf_Dat_t * pCnf;
    Aig_Obj_t * pObj;
    int Lit, Cid, Var, status, i;
    abctime clk = Abc_Clock();
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManCoNum(p) == 1 );

    // derive CNFs
    pMan = Gia_ManToAigSimple( p );
    pCnf = Cnf_Derive( pMan, 1 );

    // start the solver
    pSat = sat_solver2_new();
    pSat->fVerbose = 1;
    sat_solver2_setnvars( pSat, 2*pCnf->nVars+1 );

    // set A-variables (all used except PI/PO, which will be global variables)
    Aig_ManForEachObj( pMan, pObj, i )
        if ( pCnf->pVarNums[pObj->Id] >= 0 && !Aig_ObjIsCi(pObj) && !Aig_ObjIsCo(pObj) )
            var_set_partA( pSat, pCnf->pVarNums[pObj->Id], 1 );

    // add clauses of A
    for ( i = 0; i < pCnf->nClauses; i++ )
    {
        Cid = sat_solver2_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1], -1 );
        clause2_set_partA( pSat, Cid, 1 ); // this API should be called for each clause of A
    }

    // add clauses of B (after shifting all CNF variables by pCnf->nVars)
    Cnf_DataLift( pCnf, pCnf->nVars );
    for ( i = 0; i < pCnf->nClauses; i++ )
        sat_solver2_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1], -1 );
    Cnf_DataLift( pCnf, -pCnf->nVars );

    // add PI equality clauses
    vGVars = Vec_IntAlloc( Aig_ManCoNum(pMan)+1 );
    Aig_ManForEachCi( pMan, pObj, i )
    {
        Var = pCnf->pVarNums[pObj->Id];
        sat_solver2_add_buffer( pSat, Var, pCnf->nVars + Var, 0, 0, -1 );
        Vec_IntPush( vGVars, Var );
    }

    // add an XOR clause in the end
    Var = pCnf->pVarNums[Aig_ManCo(pMan,0)->Id];
    sat_solver2_add_xor( pSat, Var, pCnf->nVars + Var, 2*pCnf->nVars, 0, 0, -1 );
    Vec_IntPush( vGVars, Var );

    // start the interpolation manager
    pSat->pInt2 = Int2_ManStart( pSat, Vec_IntArray(vGVars), Vec_IntSize(vGVars) );

    // solve the problem
    Lit = toLitCond( 2*pCnf->nVars, 0 );
    status = sat_solver2_solve( pSat, &Lit, &Lit + 1, 0, 0, 0, 0 );
    assert( status == l_False );
    Sat_Solver2PrintStats( stdout, pSat );

    // derive interpolant
    pInter = (Gia_Man_t *)Int2_ManReadInterpolant( pSat );
    Gia_ManPrintStats( pInter, NULL );
    Abc_PrintTime( 1, "Total interpolation time", Abc_Clock() - clk );

    // clean up
    Vec_IntFree( vGVars );
    Cnf_DataFree( pCnf );
    Aig_ManStop( pMan );
    sat_solver2_delete( pSat );

    // return interpolant
    return pInter;
}